

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O0

handle_base * printable_sbo_cow::clone_impl<hi_printable>(handle_base *param_1)

{
  handle<hi_printable,_true> *phVar1;
  bool memcopyable;
  size_t size;
  size_t alignment;
  size_t buf_size;
  void *buf_ptr;
  handle_base *retval;
  buffer *buf_local;
  
  buf_ptr = (void *)0x0;
  alignment = 0x18;
  buf_size = (size_t)param_1;
  retval = param_1;
  buf_size = (size_t)std::align(8,0x18,(void **)&buf_size,&alignment);
  if ((handle<hi_printable,_false> *)buf_size == (handle<hi_printable,_false> *)0x0) {
    phVar1 = (handle<hi_printable,_true> *)operator_new(0x18);
    handle<hi_printable,_true>::handle<hi_printable>(phVar1,0);
    buf_ptr = phVar1;
  }
  else {
    handle<hi_printable,_false>::handle<hi_printable>((handle<hi_printable,_false> *)buf_size,0);
    buf_ptr = (void *)buf_size;
  }
  return (handle_base *)buf_ptr;
}

Assistant:

static handle_base * clone_impl (T value, buffer & buf)
    {
        handle_base * retval = nullptr;
        typedef typename std::remove_reference<T>::type handle_t;
        void * buf_ptr = &buf;
        std::size_t buf_size = sizeof(buf);
        const std::size_t alignment = alignof(handle<handle_t, false>);
        const std::size_t size = sizeof(handle<handle_t, false>);
        const bool memcopyable =
            std::is_trivially_destructible<typename std::remove_cv<T>::type>();
        buf_ptr =
            memcopyable ?
            std::align(alignment, size, buf_ptr, buf_size) :
            nullptr;
        if (buf_ptr) {
            new (buf_ptr) handle<handle_t, false>(std::move(value));
            retval = static_cast<handle_base *>(buf_ptr);
        } else {
            retval = new handle<handle_t, true>(std::move(value));
        }
        return retval;
    }